

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  size_t field_00;
  char *ptr_00;
  char *local_78;
  uint32_t local_6c;
  size_t sStack_68;
  uint32_t skip;
  upb_MiniTableField *field;
  char ch;
  upb_MiniTableField *puStack_58;
  _Bool need_dense_below;
  upb_MiniTableField *last_field;
  uint64_t uStack_48;
  uint32_t last_field_number;
  uint64_t msg_modifiers;
  uint16_t *field_count_local;
  size_t field_size_local;
  void *fields_local;
  size_t len_local;
  char *ptr_local;
  upb_MtDecoder *d_local;
  
  uStack_48 = 0;
  last_field._4_4_ = 0;
  puStack_58 = (upb_MiniTableField *)0x0;
  field._7_1_ = d->table != (upb_MiniTable *)0x0;
  local_78 = ptr;
  if (len != 0) {
    local_78 = ptr + len;
  }
  (d->base).end = local_78;
  msg_modifiers = (uint64_t)field_count;
  field_count_local = (uint16_t *)field_size;
  field_size_local = (size_t)fields;
  fields_local = (void *)len;
  len_local = (size_t)ptr;
  ptr_local = (char *)d;
  while( true ) {
    while( true ) {
      field_00 = field_size_local;
      if (*(ulong *)ptr_local <= len_local) {
        if ((field._7_1_ & 1) != 0) {
          *(char *)(*(long *)(ptr_local + 0xd8) + 0x15) =
               (char)*(undefined2 *)(*(long *)(ptr_local + 0xd8) + 0x12);
        }
        return (char *)len_local;
      }
      ptr_00 = (char *)(len_local + 1);
      field._6_1_ = *(uint8_t *)len_local;
      if ((char)field._6_1_ < 'J') break;
      if (((char)field._6_1_ < 'L') || ('[' < (char)field._6_1_)) {
        if (field._6_1_ == '^') {
          if (*(long *)(ptr_local + 0xd8) == 0) {
            len_local = (size_t)ptr_00;
            upb_MdDecoder_ErrorJmp((upb_MdDecoder *)ptr_local,"Extensions cannot have oneofs.");
          }
          len_local = (size_t)ptr_00;
          len_local = (size_t)upb_MtDecoder_DecodeOneofs((upb_MtDecoder *)ptr_local,ptr_00);
        }
        else {
          if (((char)field._6_1_ < '_') || ('~' < (char)field._6_1_)) {
            len_local = (size_t)ptr_00;
            upb_MdDecoder_ErrorJmp
                      ((upb_MdDecoder *)ptr_local,"Invalid char: %c",
                       (ulong)(uint)(int)(char)field._6_1_);
          }
          if ((field._7_1_ & 1) != 0) {
            *(char *)(*(long *)(ptr_local + 0xd8) + 0x15) =
                 (char)*(undefined2 *)(*(long *)(ptr_local + 0xd8) + 0x12);
            field._7_1_ = 0;
          }
          len_local = (size_t)ptr_00;
          len_local = (size_t)upb_MdDecoder_DecodeBase92Varint
                                        ((upb_MdDecoder *)ptr_local,ptr_00,field._6_1_,'_','~',
                                         &local_6c);
          last_field._4_4_ = local_6c + last_field._4_4_ + -1;
        }
      }
      else {
        len_local = (size_t)ptr_00;
        len_local = (size_t)upb_MtDecoder_ParseModifier
                                      ((upb_MtDecoder *)ptr_local,ptr_00,field._6_1_,puStack_58,
                                       &stack0xffffffffffffffb8);
        if ((uStack_48 & 4) != 0) {
          *(byte *)(*(long *)(ptr_local + 0xd8) + 0x14) =
               *(byte *)(*(long *)(ptr_local + 0xd8) + 0x14) | 1;
        }
      }
    }
    if ((*(long *)(ptr_local + 0xd8) == 0) && (puStack_58 != (upb_MiniTableField *)0x0)) break;
    sStack_68 = field_size_local;
    *(short *)msg_modifiers = *(short *)msg_modifiers + 1;
    last_field._4_4_ = last_field._4_4_ + 1;
    *(int *)field_size_local = last_field._4_4_;
    puStack_58 = (upb_MiniTableField *)field_size_local;
    field_size_local = field_size_local + (long)field_count_local;
    len_local = (size_t)ptr_00;
    upb_MiniTable_SetField
              ((upb_MtDecoder *)ptr_local,field._6_1_,(upb_MiniTableField *)field_00,uStack_48,
               sub_counts);
  }
  return (char *)len_local;
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}